

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O3

void __thiscall
LZ77Compressor::compress<LZ77Compressor::DefaultEncode&>
          (LZ77Compressor *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *out,
          uint8_t *input,int inputLength,DefaultEncode *encode)

{
  pointer puVar1;
  vector<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_> *pvVar2;
  ulong uVar3;
  pointer pIVar4;
  long lVar5;
  ulong uVar6;
  
  puVar1 = (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  pvVar2 = compress(this,input,inputLength);
  pIVar4 = (pvVar2->super__Vector_base<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(pvVar2->
                 super__Vector_base<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_>).
                 _M_impl.super__Vector_impl_data._M_finish - (long)pIVar4 >> 1) *
          -0x5555555555555555;
  uVar6 = 0;
  if (7 < (int)uVar3) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      compress_helper<LZ77Compressor::DefaultEncode>
                (this,out,(Item *)(&pIVar4->isRepeat + lVar5),8,encode);
      uVar6 = uVar6 + 8;
      pIVar4 = (pvVar2->
               super__Vector_base<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar3 = ((long)(pvVar2->
                     super__Vector_base<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pIVar4 >> 1) *
              -0x5555555555555555;
      lVar5 = lVar5 + 0x30;
    } while ((long)uVar6 < (long)((int)uVar3 + -7));
  }
  if (uVar3 <= (uVar6 & 0xffffffff)) {
    return;
  }
  compress_helper<LZ77Compressor::DefaultEncode>
            (this,out,pIVar4 + (uVar6 & 0xffffffff),(int)uVar3 - (int)uVar6,encode);
  return;
}

Assistant:

void compress(std::vector<uint8_t>& out, const uint8_t* input, int inputLength, Fn&& encode) {
		out.clear();
		const auto& vec = compress(input, inputLength);
		int i = 0;
		for (; i < static_cast<int>(vec.size()) - 7; i += 8) {
			compress_helper(out, &vec[i], 8, encode);
		}
		if (i < vec.size()) {
			compress_helper(out, &vec[i], vec.size() - i, encode);
		}
	}